

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O1

bool iDynTree::estimateExternalWrenches
               (Model *model,SubModelDecomposition *subModels,SensorsList *sensors,
               LinkUnknownWrenchContacts *unknownWrenches,JointPosDoubleArray *jointPos,
               LinkVelArray *linkVel,LinkAccArray *linkProperAcc,
               SensorsMeasurements *ftSensorsMeasurements,estimateExternalWrenchesBuffers *bufs,
               LinkContactWrenches *outputContactWrenches)

{
  pointer pVVar1;
  double dVar2;
  Model *model_00;
  JointPosDoubleArray *jointPos_00;
  long lVar3;
  Traversal *subModelTraversal;
  long lVar4;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  size_t subModelIndex;
  bool local_169;
  DenseStorage<double,__1,__1,__1,_1> local_168;
  LinkUnknownWrenchContacts *local_150;
  SubModelDecomposition *local_148;
  Model *local_140;
  SensorsList *local_138;
  JointPosDoubleArray *local_130;
  LinkVelArray *local_128;
  Traversal *local_120;
  pointer local_118 [2];
  Wrench knownTerms;
  void *local_d0 [3];
  void *local_b8;
  void *local_a8;
  void *local_98;
  void *local_88;
  void *local_78;
  void *local_68;
  
  local_150 = unknownWrenches;
  local_140 = model;
  local_138 = sensors;
  local_130 = jointPos;
  local_128 = linkVel;
  iDynTree::LinkContactWrenches::resize((Model *)outputContactWrenches);
  lVar3 = iDynTree::SubModelDecomposition::getNrOfSubModels();
  local_169 = lVar3 == 0;
  if (!local_169) {
    subModelIndex = 0;
    local_148 = subModels;
    do {
      subModelTraversal =
           (Traversal *)iDynTree::SubModelDecomposition::getTraversal((ulong)subModels);
      jointPos_00 = local_130;
      model_00 = local_140;
      computeKnownTermsOfEstimationEquationWithInternalFT
                (&knownTerms,local_140,subModelTraversal,local_138,local_130,local_128,linkProperAcc
                 ,ftSensorsMeasurements,bufs);
      pVVar1 = (bufs->b).
               super__Vector_base<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar1[subModelIndex].m_data[0] = (double)knownTerms._8_8_;
      pVVar1[subModelIndex].m_data[1] = (double)knownTerms._16_8_;
      pVVar1[subModelIndex].m_data[2] = (double)knownTerms._24_8_;
      (pVVar1[subModelIndex].m_data + 2)[1] = (double)knownTerms._32_8_;
      pVVar1[subModelIndex].m_data[4] = (double)knownTerms._40_8_;
      (pVVar1[subModelIndex].m_data + 4)[1] = (double)knownTerms._48_8_;
      local_120 = subModelTraversal;
      computeMatrixOfEstimationEquationAndExtWrenchKnownTerms
                (model_00,subModelTraversal,local_150,jointPos_00,subModelIndex,bufs);
      lVar3 = iDynTree::MatrixDynSize::rows();
      if ((lVar3 != 0) && (lVar3 = iDynTree::MatrixDynSize::cols(), lVar3 != 0)) {
        lVar3 = iDynTree::MatrixDynSize::data();
        lVar4 = iDynTree::MatrixDynSize::rows();
        lVar5 = iDynTree::MatrixDynSize::cols();
        local_168.m_data = (double *)0x0;
        local_168.m_rows = 0;
        local_168.m_cols = 0;
        if ((lVar4 != 0) || (lVar5 != 0)) {
          if ((lVar5 != 0 && lVar4 != 0) &&
             (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar5),0) < lVar4)
             ) {
            puVar9 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar9 = iDynTree::SubModelDecomposition::~SubModelDecomposition;
            __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_168,lVar5 * lVar4,lVar4,lVar5);
        }
        lVar4 = local_168.m_cols * local_168.m_rows;
        uVar10 = lVar4 - (lVar4 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < lVar4) {
          lVar5 = 0;
          do {
            pdVar6 = (double *)(lVar3 + lVar5 * 8);
            dVar2 = pdVar6[1];
            local_168.m_data[lVar5] = *pdVar6;
            (local_168.m_data + lVar5)[1] = dVar2;
            lVar5 = lVar5 + 2;
          } while (lVar5 < (long)uVar10);
        }
        if ((long)uVar10 < lVar4) {
          do {
            local_168.m_data[uVar10] = *(double *)(lVar3 + uVar10 * 8);
            uVar10 = uVar10 + 1;
          } while (lVar4 - uVar10 != 0);
        }
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
        ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_d0,
                   (EigenBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_168);
        free(local_168.m_data);
        local_118[0] = (bufs->b).
                       super__Vector_base<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + subModelIndex;
        pdVar6 = (double *)iDynTree::VectorDynSize::data();
        local_168.m_rows = iDynTree::VectorDynSize::size();
        local_168.m_data = pdVar6;
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
        _solve_impl<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                  ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_d0,
                   (Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_> *)local_118,
                   (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                   &local_168);
        free(local_68);
        free(local_78);
        free(local_88);
        free(local_98);
        free(local_a8);
        free(local_b8);
        free(local_d0[0]);
      }
      uVar10 = 0;
      do {
        uVar7 = uVar10;
        uVar8 = iDynTree::VectorDynSize::size();
        if (uVar8 <= uVar7) {
          storeResultsOfEstimation(local_120,local_150,subModelIndex,bufs,outputContactWrenches);
          goto LAB_0013ca9e;
        }
        pdVar6 = (double *)
                 iDynTree::VectorDynSize::operator()
                           ((bufs->x).
                            super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                            ._M_impl.super__Vector_impl_data._M_start + subModelIndex * 0x20,uVar7);
        uVar10 = uVar7 + 1;
      } while (!NAN(*pdVar6));
      iDynTree::reportError
                ("","estimateExternalWrenches","NaN found in estimation result, estimation failed");
LAB_0013ca9e:
      iDynTree::SpatialForceVector::~SpatialForceVector(&knownTerms.super_SpatialForceVector);
      subModels = local_148;
      if (uVar7 < uVar8) {
        return local_169;
      }
      subModelIndex = subModelIndex + 1;
      uVar10 = iDynTree::SubModelDecomposition::getNrOfSubModels();
      local_169 = subModelIndex >= uVar10;
    } while (subModelIndex < uVar10);
  }
  return local_169;
}

Assistant:

bool estimateExternalWrenches(const Model& model,
                              const SubModelDecomposition& subModels,
                              const SensorsList& sensors,
                              const LinkUnknownWrenchContacts& unknownWrenches,
                              const JointPosDoubleArray & jointPos,
                              const LinkVelArray& linkVel,
                              const LinkAccArray& linkProperAcc,
                              const SensorsMeasurements& ftSensorsMeasurements,
                                    estimateExternalWrenchesBuffers& bufs,
                                    LinkContactWrenches& outputContactWrenches)
{
    /**< value extracted from old iDynContact */
    double tol = 1e-7;

    // Resize the output data structure
    outputContactWrenches.resize(model);

    // Solve the problem for each submodel
    for(size_t sm=0; sm < subModels.getNrOfSubModels(); sm++ )
    {
        // Number of unknowns for this submodel
        const Traversal & subModelTraversal = subModels.getTraversal(sm);

        // First compute the known term of the estimation for each link:
        // this loop is similar to the dynamic phase of the RNEA
        // \todo pimp up performance as done in RNEADynamicPhase
        Wrench knownTerms = computeKnownTermsOfEstimationEquationWithInternalFT(model,subModelTraversal,
                                sensors,jointPos,linkVel,linkProperAcc,ftSensorsMeasurements,bufs);

        // Copy knownTerms in the buffers used for estimation
        bufs.b[sm] = knownTerms.asVector();

        // Now we compute the A matrix
        computeMatrixOfEstimationEquationAndExtWrenchKnownTerms(model,subModelTraversal,unknownWrenches,jointPos,sm,bufs);

        // If A has no unkowns then pseudoInverse can not be computed
        // In that case, we do not compute the x vector because it will have zero elements 
        if (bufs.A[sm].rows() > 0 && bufs.A[sm].cols() > 0) {
	    toEigen(bufs.x[sm]) = toEigen(bufs.A[sm]).colPivHouseholderQr().solve(toEigen(bufs.b[sm]));	    
        }

        // Check if there are any nan in the estimation results
        bool someResultIsNan = false;
        for(size_t i=0; i < bufs.x[sm].size(); i++)
        {
            if( std::isnan(bufs.x[sm](i)) )
            {
                someResultIsNan = true;
                break;
            }
        }

        if (someResultIsNan)
        {
            reportError("", "estimateExternalWrenches", "NaN found in estimation result, estimation failed");
            return false;
        }

        // We copy the estimated unknowns in the outputContactWrenches
        // Note that the logic of conversion between input/output contacts should be
        // the same used before in computeMatrixOfEstimationEquation
        storeResultsOfEstimation(subModelTraversal,unknownWrenches,sm,bufs,outputContactWrenches);
    }

    return true;
}